

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_duckdb::LogicalType_&,_const_duckdb::LogicalTypeId_&>::
streamReconstructedExpression
          (BinaryExpr<const_duckdb::LogicalType_&,_const_duckdb::LogicalTypeId_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  uchar c;
  string *in_R9;
  StringRef op;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,Detail::unprintableString_abi_cxx11_,
             DAT_005d9d58 + Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<unsigned_char,void>::convert_abi_cxx11_
            (&local_48,(StringMaker<unsigned_char,void> *)(ulong)*this->m_rhs,c);
  op.m_size = (size_type)&local_48;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_68,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }